

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_rowcol_blocked_sse41_128_32
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  __m128i alVar2;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  __m128i *palVar14;
  int iVar15;
  __m128i *in_R11;
  size_t size;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i_32_t h;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar27;
  uint uVar28;
  undefined1 auVar26 [16];
  uint uVar29;
  int iVar32;
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  int iVar39;
  undefined1 auVar36 [16];
  int iVar40;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  __m128i_32_t t;
  longlong local_48;
  longlong lStack_40;
  
  uVar5 = s1Len + 6;
  if (-1 < (int)(s1Len + 3U)) {
    uVar5 = s1Len + 3U;
  }
  uVar16 = (int)uVar5 >> 2;
  ptr = parasail_memalign___m128i(0x10,(long)(int)(uVar16 * 0x18));
  size = (size_t)(int)uVar16;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  ppVar3 = parasail_result_new_rowcol1(uVar5 & 0xfffffffc,s2Len);
  uVar5 = 1;
  if (1 < (int)uVar16) {
    uVar5 = uVar16;
  }
  iVar7 = 0;
  lVar4 = 0;
  do {
    iVar7 = iVar7 + 1;
    while (s1Len < 1) {
      iVar7 = iVar7 + 1;
      if (iVar7 == 0x19) {
        auVar17._4_4_ = open;
        auVar17._0_4_ = open;
        auVar17._8_4_ = open;
        auVar17._12_4_ = open;
        uVar16 = -(-s1Len & 3U);
        goto LAB_0071591b;
      }
    }
    lVar4 = (long)(int)lVar4;
    lVar8 = 0;
    uVar16 = 0;
    do {
      lVar11 = 0;
      lVar13 = lVar8;
      do {
        in_R11 = (__m128i *)0x0;
        if (lVar13 < s1Len) {
          in_R11 = (__m128i *)
                   (ulong)(uint)matrix->matrix
                                [(long)matrix->mapper[(byte)s1[lVar13]] * (long)matrix->size];
        }
        *(int *)((long)&local_48 + lVar11) = (int)in_R11;
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x10);
      ptr[lVar4][0] = local_48;
      ptr[lVar4][1] = lStack_40;
      lVar4 = lVar4 + 1;
      uVar16 = uVar16 + 1;
      lVar8 = lVar8 + 4;
    } while (uVar16 != uVar5);
  } while (iVar7 != 0x18);
  uVar16 = s1Len & 3;
  auVar17._4_4_ = open;
  auVar17._0_4_ = open;
  auVar17._8_4_ = open;
  auVar17._12_4_ = open;
  if (0 < s1Len) {
    iVar7 = -open;
    lVar4 = 0;
    do {
      *(undefined1 (*) [16])((long)*ptr_00 + lVar4) = (undefined1  [16])0x0;
      piVar1 = (int *)((long)*ptr_01 + lVar4);
      *piVar1 = iVar7;
      piVar1[1] = iVar7;
      piVar1[2] = iVar7;
      piVar1[3] = iVar7;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar4);
  }
LAB_0071591b:
  if (s2Len < 1) {
    auVar18 = (undefined1  [16])0x0;
  }
  else {
    iVar7 = auVar17._12_4_;
    uVar9 = 0;
    auVar18 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar6 = matrix->mapper[(byte)s2[uVar9]];
        auVar26 = (undefined1  [16])0x0;
        uVar12 = 0;
        auVar19 = auVar18;
        uVar10 = 0xc0000000;
        do {
          alVar2 = ptr_00[uVar12];
          palVar14 = ptr_01 + uVar12;
          iVar21 = (int)(*palVar14)[0];
          iVar22 = *(int *)((long)*palVar14 + 4);
          iVar23 = (int)(*palVar14)[1];
          iVar24 = *(int *)((long)*palVar14 + 0xc);
          auVar36._0_8_ = alVar2[0] << 0x20;
          auVar36._8_8_ = alVar2[1] << 0x20 | alVar2[0] >> 0x20;
          auVar36 = auVar36 | auVar26;
          palVar14 = ptr + (long)iVar6 * size + uVar12;
          iVar35 = auVar36._0_4_ + (int)(*palVar14)[0];
          iVar38 = auVar36._4_4_ + *(int *)((long)*palVar14 + 4);
          iVar39 = auVar36._8_4_ + (int)(*palVar14)[1];
          iVar40 = auVar36._12_4_ + *(int *)((long)*palVar14 + 0xc);
          iVar32 = (uint)(-1 < iVar21) * iVar21;
          iVar15 = (uint)(-1 < iVar22) * iVar22;
          iVar34 = (uint)(-1 < iVar23) * iVar23;
          iVar33 = (uint)(-1 < iVar24) * iVar24;
          uVar25 = (uint)(iVar32 < iVar35) * iVar35 | (uint)(iVar32 >= iVar35) * iVar32;
          uVar27 = (uint)(iVar15 < iVar38) * iVar38 | (uint)(iVar15 >= iVar38) * iVar15;
          uVar28 = (uint)(iVar34 < iVar39) * iVar39 | (uint)(iVar34 >= iVar39) * iVar34;
          uVar29 = (uint)(iVar33 < iVar40) * iVar40 | (uint)(iVar33 >= iVar40) * iVar33;
          auVar26._0_4_ = uVar10 - auVar17._0_4_;
          auVar26._4_4_ = uVar25 - auVar17._4_4_;
          auVar26._8_4_ = uVar27 - auVar17._8_4_;
          auVar26._12_4_ = uVar28 - iVar7;
          auVar30._0_4_ = -(uint)(0 < auVar26._0_4_);
          auVar30._4_4_ = -(uint)(0 < auVar26._4_4_);
          auVar30._8_4_ = -(uint)(0 < auVar26._8_4_);
          auVar30._12_4_ = -(uint)(0 < auVar26._12_4_);
          iVar15 = movmskps((int)in_R11,auVar30);
          auVar18 = auVar26;
          uVar10 = uVar29;
          if (iVar15 != 0) {
            do {
              iVar32 = -gap;
              auVar37._4_4_ = auVar26._0_4_ - gap;
              auVar37._0_4_ = iVar32;
              auVar37._8_4_ = auVar26._4_4_ - gap;
              auVar37._12_4_ = auVar26._8_4_ - gap;
              iVar33 = auVar18._0_4_;
              auVar41._0_4_ = (uint)(iVar33 < iVar32) * iVar32 | (uint)(iVar33 >= iVar32) * iVar33;
              iVar32 = auVar18._4_4_;
              auVar41._4_4_ =
                   (uint)(iVar32 < auVar37._4_4_) * auVar37._4_4_ |
                   (uint)(iVar32 >= auVar37._4_4_) * iVar32;
              iVar32 = auVar18._8_4_;
              iVar33 = auVar18._12_4_;
              auVar41._8_4_ =
                   (uint)(iVar32 < auVar37._8_4_) * auVar37._8_4_ |
                   (uint)(iVar32 >= auVar37._8_4_) * iVar32;
              auVar41._12_4_ =
                   (uint)(iVar33 < auVar37._12_4_) * auVar37._12_4_ |
                   (uint)(iVar33 >= auVar37._12_4_) * iVar33;
              auVar31._0_4_ = -(uint)(gap < 0);
              auVar31._4_4_ = -(uint)(0 < auVar37._4_4_);
              auVar31._8_4_ = -(uint)(0 < auVar37._8_4_);
              auVar31._12_4_ = -(uint)(0 < auVar37._12_4_);
              iVar15 = movmskps(iVar15,auVar31);
              auVar26 = auVar37;
              auVar18 = auVar41;
            } while (iVar15 != 0);
            uVar25 = ((int)uVar25 < (int)auVar41._0_4_) * auVar41._0_4_ |
                     ((int)uVar25 >= (int)auVar41._0_4_) * uVar25;
            uVar27 = ((int)uVar27 < (int)auVar41._4_4_) * auVar41._4_4_ |
                     ((int)uVar27 >= (int)auVar41._4_4_) * uVar27;
            uVar28 = ((int)uVar28 < (int)auVar41._8_4_) * auVar41._8_4_ |
                     ((int)uVar28 >= (int)auVar41._8_4_) * uVar28;
            uVar29 = ((int)uVar29 < (int)auVar41._12_4_) * auVar41._12_4_ |
                     ((int)uVar29 >= (int)auVar41._12_4_) * uVar29;
            iVar15 = auVar41._12_4_ + (iVar7 - gap);
            uVar10 = (iVar15 < (int)uVar29) * uVar29 | (uint)(iVar15 >= (int)uVar29) * iVar15;
          }
          in_R11 = ptr_00 + uVar12;
          palVar14 = ptr_01 + uVar12;
          auVar26 = (undefined1  [16])alVar2 >> 0x60;
          *(uint *)*in_R11 = uVar25;
          *(uint *)((long)*in_R11 + 4) = uVar27;
          *(uint *)(*in_R11 + 1) = uVar28;
          *(uint *)((long)*in_R11 + 0xc) = uVar29;
          iVar15 = auVar19._0_4_;
          auVar18._0_4_ = (iVar15 < (int)uVar25) * uVar25 | (uint)(iVar15 >= (int)uVar25) * iVar15;
          iVar15 = auVar19._4_4_;
          auVar18._4_4_ = (iVar15 < (int)uVar27) * uVar27 | (uint)(iVar15 >= (int)uVar27) * iVar15;
          iVar15 = auVar19._8_4_;
          iVar32 = auVar19._12_4_;
          auVar18._8_4_ = (iVar15 < (int)uVar28) * uVar28 | (uint)(iVar15 >= (int)uVar28) * iVar15;
          auVar18._12_4_ = (iVar32 < (int)uVar29) * uVar29 | (uint)(iVar32 >= (int)uVar29) * iVar32;
          iVar15 = uVar25 - auVar17._0_4_;
          iVar32 = uVar27 - auVar17._4_4_;
          iVar33 = uVar28 - auVar17._8_4_;
          iVar34 = uVar29 - iVar7;
          iVar21 = iVar21 - gap;
          iVar22 = iVar22 - gap;
          iVar23 = iVar23 - gap;
          iVar24 = iVar24 - gap;
          *(uint *)*palVar14 = (uint)(iVar21 < iVar15) * iVar15 | (uint)(iVar21 >= iVar15) * iVar21;
          *(uint *)((long)*palVar14 + 4) =
               (uint)(iVar22 < iVar32) * iVar32 | (uint)(iVar22 >= iVar32) * iVar22;
          *(uint *)(*palVar14 + 1) =
               (uint)(iVar23 < iVar33) * iVar33 | (uint)(iVar23 >= iVar33) * iVar23;
          *(uint *)((long)*palVar14 + 0xc) =
               (uint)(iVar24 < iVar34) * iVar34 | (uint)(iVar24 >= iVar34) * iVar24;
          uVar12 = uVar12 + 1;
          auVar19 = auVar18;
        } while (uVar12 != uVar5);
      }
      uVar12 = ptr_00[size - 1][0];
      uVar20 = ptr_00[size - 1][1];
      uVar10 = uVar16;
      if (0 < (int)uVar16) {
        do {
          uVar20 = uVar20 << 0x10 | uVar12 >> 0x30;
          uVar10 = uVar10 - 1;
          uVar12 = uVar12 << 0x10;
        } while (uVar10 != 0);
      }
      ((ppVar3->field_4).rowcols)->score_row[uVar9] = (int)(short)(uVar20 >> 0x30);
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)s2Len);
  }
  if (0 < s1Len) {
    lVar4 = 0;
    do {
      auVar17 = pmovsxwd(auVar17,*(undefined8 *)((long)*ptr_00 + lVar4));
      *(undefined1 (*) [16])((long)((ppVar3->field_4).rowcols)->score_col + lVar4) = auVar17;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar4);
  }
  iVar7 = -0x40000000;
  iVar6 = 4;
  do {
    uVar9 = auVar18._0_8_;
    lVar4 = auVar18._8_8_;
    if (iVar7 < auVar18._12_4_) {
      iVar7 = auVar18._12_4_;
    }
    auVar18._0_8_ = uVar9 << 0x20;
    auVar18._8_8_ = lVar4 << 0x20 | uVar9 >> 0x20;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  ppVar3->score = iVar7;
  ppVar3->flag = ppVar3->flag | 0x8242004;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar3;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 4; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_32;
    __m128i vGapO = _mm_set1_epi32(open);
    __m128i vGapE = _mm_set1_epi32(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi32(NEG_INF_32);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_32_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 12); /* rshift 3 */
            vH = _mm_slli_si128(vH, 4); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi32(vH, vP);
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vZero);

            vF = _mm_srli_si128(vF, 12);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 4));
            vF = _mm_sub_epi32(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi32(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi32(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 4);
                    vT2 = _mm_sub_epi32(vT2, vGapE);
                    vF = _mm_max_epi32(vF, vT2);
                }
                vH = _mm_max_epi32(vH, vF);
                vF = _mm_add_epi32(vF, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                vF = _mm_max_epi32(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vMaxH, vH);

            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int32_t value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}